

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

void __thiscall helics::apps::Recorder::addEndpoint(Recorder *this,string_view endpoint)

{
  InterfaceVisibility IVar1;
  iterator iVar2;
  size_type sVar3;
  _Elt_pointer pEVar4;
  string *psVar5;
  InterfaceVisibility *pIVar6;
  int index;
  InterfaceHandle endpointId;
  InterfaceVisibility local_50;
  InterfaceHandle local_4c;
  key_type local_48;
  key_type local_38;
  
  local_38._M_str = endpoint._M_str;
  local_38._M_len = endpoint._M_len;
  iVar2 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->eptNames)._M_t,&local_38);
  if (((_Rb_tree_header *)iVar2._M_node == &(this->eptNames)._M_t._M_impl.super__Rb_tree_header) ||
     (*(int *)&iVar2._M_node[1]._M_left == -1)) {
    local_50 = GLOBAL;
    local_48._M_len =
         (size_t)(this->super_App).fed.
                 super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::
    emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&>
              ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,
               &local_50,(CombinationFederate **)&local_48,&local_38);
    sVar3 = CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::size
                      (&this->endpoints);
    local_50 = (int)sVar3 - GLOBAL;
    pEVar4 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pEVar4 == (this->endpoints).
                  super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pEVar4 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 4;
    }
    local_4c.hid = pEVar4[-1].super_Interface.handle.hid;
    std::
    _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
    ::_M_emplace_unique<helics::InterfaceHandle&,int&>
              ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,int>,std::_Select1st<std::pair<helics::InterfaceHandle_const,int>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,int>>>
                *)&this->eptids,&local_4c,(int *)&local_50);
    IVar1 = local_50;
    pEVar4 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pEVar4 == (this->endpoints).
                  super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pEVar4 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 4;
    }
    psVar5 = Interface::getName_abi_cxx11_(&pEVar4[-1].super_Interface);
    local_48._M_str = (psVar5->_M_dataplus)._M_p;
    local_48._M_len = psVar5->_M_string_length;
    pIVar6 = (InterfaceVisibility *)
             CLI::std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[](&this->eptNames,&local_48);
    *pIVar6 = IVar1;
  }
  return;
}

Assistant:

void Recorder::addEndpoint(std::string_view endpoint)
{
    auto res = eptNames.find(endpoint);
    if ((res == eptNames.end()) || (res->second == -1)) {
        endpoints.emplace_back(InterfaceVisibility::GLOBAL, fed.get(), endpoint);
        auto index = static_cast<int>(endpoints.size()) - 1;
        auto endpointId = endpoints.back().getHandle();
        eptids.emplace(endpointId, index);  // this is a new element
        eptNames[endpoints.back().getName()] = index;  // this is a potential replacement
    }
}